

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_image *
rf_image_resize_nn(rf_image *__return_storage_ptr__,rf_image image,int new_width,int new_height,
                  rf_allocator allocator)

{
  rf_source_location rVar1;
  undefined1 auVar2 [24];
  int iVar3;
  void *dst;
  rf_allocator_proc *prVar4;
  uint uVar5;
  long in_FS_OFFSET;
  uint uStack_8c;
  rf_allocator allocator_local;
  
  prVar4 = allocator.allocator_proc;
  allocator_local.user_data = allocator.user_data;
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  allocator_local.allocator_proc = prVar4;
  if (image.valid == true) {
    iVar3 = rf_bytes_per_pixel(image.format);
    uVar5 = iVar3 * new_height * new_width;
    rVar1.proc_name._0_4_ = 0x172fd9;
    rVar1.file_name =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    rVar1.proc_name._4_4_ = 0;
    rVar1.line_in_file = 0x3e70;
    auVar2._8_8_ = (ulong)uStack_8c << 0x20;
    auVar2._0_8_ = (long)(int)uVar5;
    auVar2._16_8_ = 0;
    dst = (*prVar4)(&allocator_local,rVar1,RF_AM_ALLOC,(rf_allocator_args)(auVar2 << 0x40));
    if (dst == (void *)0x0) {
      rf_log_impl(8,0x172bc3,(char *)0x2,(ulong)uVar5);
      *(char **)(in_FS_OFFSET + -0x450) =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      *(char **)(in_FS_OFFSET + -0x448) = "rf_image_resize_nn";
      *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x3e76;
      *(undefined4 *)(in_FS_OFFSET + -0x438) = 2;
    }
    else {
      rf_image_resize_nn_to_buffer
                (__return_storage_ptr__,image,new_width,new_height,dst,(long)(int)uVar5);
    }
  }
  else {
    rf_log_impl(8,0x172f3a,(char *)0x1);
    *(char **)(in_FS_OFFSET + -0x450) =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    *(char **)(in_FS_OFFSET + -0x448) = "rf_image_resize_nn";
    *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x3e78;
    *(undefined4 *)(in_FS_OFFSET + -0x438) = 1;
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_image_resize_nn(rf_image image, int new_width, int new_height, rf_allocator allocator)
{
    rf_image result = {0};

    if (image.valid)
    {
        int dst_size = new_width * new_height * rf_bytes_per_pixel(image.format);
        void* dst = RF_ALLOC(allocator, dst_size);

        if (dst)
        {
            result = rf_image_resize_nn_to_buffer(image, new_width, new_height, dst, dst_size);
        }
        else RF_LOG_ERROR(RF_BAD_ALLOC, "Allocation of size %d failed.", dst_size);
    }
    else RF_LOG_ERROR(RF_BAD_ARGUMENT, "Image is invalid.");

    return result;
}